

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::PipelineBarrier::submit(PipelineBarrier *this,SubmitContext *context)

{
  Type TVar1;
  DeviceInterface *pDVar2;
  _func_int **pp_Var3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  VkMemoryBarrier *pVVar7;
  undefined8 uVar8;
  VkMemoryBarrier *pVVar9;
  undefined8 uVar10;
  VkMemoryBarrier *pVVar11;
  VkMemoryBarrier barrier;
  
  pDVar2 = context->m_context->m_context->m_vkd;
  TVar1 = this->m_type;
  if (TVar1 == TYPE_IMAGE) {
    pVVar11 = &barrier;
    barrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    pVVar7 = (VkMemoryBarrier *)0x0;
    barrier.srcAccessMask = this->m_srcAccesses;
    barrier.dstAccessMask = this->m_dstAccesses;
    uVar5 = (ulong)this->m_srcStages;
    uVar4 = (ulong)this->m_dstStages;
    pp_Var3 = pDVar2->_vptr_DeviceInterface;
    uVar6 = 0;
    uVar10 = 1;
    pVVar9 = (VkMemoryBarrier *)0x0;
    uVar8 = 0;
  }
  else if (TVar1 == TYPE_BUFFER) {
    pVVar9 = &barrier;
    barrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    pVVar7 = (VkMemoryBarrier *)0x0;
    barrier.srcAccessMask = this->m_srcAccesses;
    barrier.dstAccessMask = this->m_dstAccesses;
    uVar5 = (ulong)this->m_srcStages;
    uVar4 = (ulong)this->m_dstStages;
    pp_Var3 = pDVar2->_vptr_DeviceInterface;
    uVar6 = 0;
    pVVar11 = (VkMemoryBarrier *)0x0;
    uVar10 = 0;
    uVar8 = 1;
  }
  else {
    if (TVar1 != TYPE_GLOBAL) {
      return;
    }
    pVVar7 = &barrier;
    barrier.sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
    barrier.srcAccessMask = this->m_srcAccesses;
    barrier.dstAccessMask = this->m_dstAccesses;
    uVar5 = (ulong)this->m_srcStages;
    uVar4 = (ulong)this->m_dstStages;
    pp_Var3 = pDVar2->_vptr_DeviceInterface;
    uVar6 = 1;
    pVVar11 = (VkMemoryBarrier *)0x0;
    uVar10 = 0;
    pVVar9 = (VkMemoryBarrier *)0x0;
    uVar8 = 0;
  }
  barrier.pNext = (void *)0x0;
  (*pp_Var3[0x6d])(pDVar2,context->m_commandBuffer,uVar5,uVar4,0,uVar6,pVVar7,uVar8,pVVar9,uVar10,
                   pVVar11);
  return;
}

Assistant:

void PipelineBarrier::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd	= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd	= context.getCommandBuffer();

	switch (m_type)
	{
		case TYPE_GLOBAL:
		{
			const vk::VkMemoryBarrier	barrier		=
			{
				vk::VK_STRUCTURE_TYPE_MEMORY_BARRIER,
				DE_NULL,

				m_srcAccesses,
				m_dstAccesses
			};

			vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 1, &barrier, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
			break;
		}

		case TYPE_BUFFER:
		{
			const vk::VkBufferMemoryBarrier	barrier		=
			{
				vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
				DE_NULL,

				m_srcAccesses,
				m_dstAccesses,

				VK_QUEUE_FAMILY_IGNORED,
				VK_QUEUE_FAMILY_IGNORED,

				context.getBuffer(),
				0,
				VK_WHOLE_SIZE
			};

			vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &barrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
			break;
		}

		case TYPE_IMAGE:
		{
			const vk::VkImageMemoryBarrier	barrier		=
			{
				vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
				DE_NULL,

				m_srcAccesses,
				m_dstAccesses,

				*m_imageLayout,
				*m_imageLayout,

				VK_QUEUE_FAMILY_IGNORED,
				VK_QUEUE_FAMILY_IGNORED,

				context.getImage(),
				{
					vk::VK_IMAGE_ASPECT_COLOR_BIT,
					0, 1,
					0, 1
				}
			};

			vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);
			break;
		}

		default:
			DE_FATAL("Unknown pipeline barrier type");
	}
}